

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomBasisCurves *curves,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  string *psVar3;
  Attribute *pAVar4;
  AttrMeta *pAVar5;
  AttrMeta *pAVar6;
  size_type sVar7;
  Property *pPVar8;
  mapped_type *this;
  ostream *poVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  undefined8 in_stack_ffffffffffffe4e8;
  undefined4 uVar11;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *target;
  bool local_1ae1;
  bool local_1ab9;
  bool local_1a91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a08 [32];
  string local_19e8 [32];
  ostringstream local_19c8 [8];
  ostringstream ss_w_3;
  allocator local_1829;
  undefined1 local_1828 [71];
  allocator local_17e1;
  string local_17e0;
  undefined1 local_17c0 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_2;
  Attribute *attr_2;
  allocator local_1781;
  undefined1 local_1780 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1740 [32];
  ostringstream local_1720 [8];
  ostringstream ss_w_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a8;
  string local_1588;
  allocator local_1561;
  undefined1 local_1560 [56];
  undefined1 local_1528 [71];
  allocator local_14e1;
  string local_14e0;
  undefined1 local_14c0 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_1;
  allocator local_1481;
  undefined1 local_1480 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1440 [32];
  ostringstream local_1420 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  string local_1288;
  allocator local_1261;
  undefined1 local_1260 [56];
  undefined1 local_1228 [71];
  allocator local_11e1;
  string local_11e0;
  undefined1 local_11c0 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr;
  allocator local_1181;
  undefined1 local_1180 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1140 [32];
  ostringstream local_1120 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa8;
  string local_f88;
  allocator local_f61;
  undefined1 local_f60 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20 [39];
  allocator local_ef9;
  string local_ef8 [32];
  string local_ed8;
  ostringstream local_eb8 [8];
  ostringstream ss_e_5;
  allocator local_d39;
  undefined1 local_d38 [32];
  undefined1 local_d18 [40];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0 [39];
  allocator local_c89;
  string local_c88 [32];
  string local_c68;
  ostringstream local_c48 [8];
  ostringstream ss_e_4;
  allocator local_ac9;
  undefined1 local_ac8 [32];
  undefined1 local_aa8 [40];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40 [39];
  allocator local_a19;
  string local_a18 [32];
  string local_9f8;
  ostringstream local_9d8 [8];
  ostringstream ss_e_3;
  allocator local_859;
  undefined1 local_858 [32];
  undefined1 local_838 [32];
  undefined1 local_818 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0 [39];
  allocator local_7a9;
  string local_7a8 [32];
  string local_788;
  ostringstream local_768 [8];
  ostringstream ss_e_2;
  allocator local_5e9;
  undefined1 local_5e8 [32];
  undefined1 local_5c8 [32];
  undefined1 local_5a8 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560 [39];
  allocator local_539;
  string local_538 [32];
  string local_518;
  ostringstream local_4f8 [8];
  ostringstream ss_e_1;
  allocator local_379;
  undefined1 local_378 [32];
  undefined1 local_358 [32];
  undefined1 local_338 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8;
  ostringstream local_288 [8];
  ostringstream ss_e;
  allocator local_109;
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_78 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  anon_class_1_0_00000001 WrapHandler;
  anon_class_1_0_00000001 TypeHandler;
  anon_class_1_0_00000001 BasisHandler;
  string *err_local;
  string *warn_local;
  GeomBasisCurves *curves_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffe4e8 >> 0x20);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_78);
  bVar1 = (bool)(options->strict_allowedToken_check & 1);
  target = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
           CONCAT44(uVar11,(uint)bVar1);
  bVar1 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_78,properties,&curves->super_GPrim,warn,err,bVar1);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      ret.err.field_2._8_8_ =
           ::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
           ::operator*(&__end2);
      ::std::__cxx11::string::string((string *)local_e8,(string *)ret.err.field_2._8_8_);
      psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_108,"curveVertexCounts",&local_109);
      pPVar8 = (Property *)local_108;
      (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                ((ParseResult *)local_c8,(_anonymous_namespace_ *)local_78,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8,psVar3,pPVar8,(string *)&curves->curveVertexCounts,target);
      ::std::__cxx11::string::~string((string *)local_108);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
      ::std::__cxx11::string::~string((string *)local_e8);
      if ((local_c8._0_4_ == Success) || (local_c8._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_c8._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_288);
        poVar9 = ::std::operator<<((ostream *)local_288,"[error]");
        poVar9 = ::std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar9 = ::std::operator<<(poVar9,":");
        poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
        poVar9 = ::std::operator<<(poVar9,"():");
        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc35);
        ::std::operator<<(poVar9," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_2c9);
        fmt::format<char[18],std::__cxx11::string>
                  (&local_2a8,(fmt *)local_2c8,(string *)"curveVertexCounts",(char (*) [18])&ret,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
        poVar9 = ::std::operator<<((ostream *)local_288,(string *)&local_2a8);
        ::std::operator<<(poVar9,"\n");
        ::std::__cxx11::string::~string((string *)&local_2a8);
        ::std::__cxx11::string::~string(local_2c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_1.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=((string *)err,(string *)local_2f0);
          ::std::__cxx11::string::~string((string *)local_2f0);
          ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_288);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_c8);
      if (__range2._4_4_ != 0) {
        if (__range2._4_4_ == 3) goto LAB_002afde6;
        goto LAB_002afe02;
      }
      ::std::__cxx11::string::string((string *)local_358,(string *)ret.err.field_2._8_8_);
      psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_378,"points",&local_379);
      pPVar8 = (Property *)local_378;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                ((ParseResult *)local_338,(_anonymous_namespace_ *)local_78,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_358,psVar3,pPVar8,(string *)&curves->points,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                  *)target);
      ::std::__cxx11::string::~string((string *)local_378);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
      ::std::__cxx11::string::~string((string *)local_358);
      if ((local_338._0_4_ == Success) || (local_338._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_338._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4f8);
        poVar9 = ::std::operator<<((ostream *)local_4f8,"[error]");
        poVar9 = ::std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar9 = ::std::operator<<(poVar9,":");
        poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
        poVar9 = ::std::operator<<(poVar9,"():");
        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc36);
        ::std::operator<<(poVar9," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_538,"Parsing attribute `{}` failed. Error: {}",&local_539);
        fmt::format<char[7],std::__cxx11::string>
                  (&local_518,(fmt *)local_538,(string *)"points",(char (*) [7])&ret_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
        poVar9 = ::std::operator<<((ostream *)local_4f8,(string *)&local_518);
        ::std::operator<<(poVar9,"\n");
        ::std::__cxx11::string::~string((string *)&local_518);
        ::std::__cxx11::string::~string(local_538);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_539);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_560,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=((string *)err,(string *)local_560);
          ::std::__cxx11::string::~string((string *)local_560);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_4f8);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_338);
      if (__range2._4_4_ == 0) {
        ::std::__cxx11::string::string((string *)local_5c8,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_5e8,"velocities",&local_5e9);
        pPVar8 = (Property *)local_5e8;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((ParseResult *)local_5a8,(_anonymous_namespace_ *)local_78,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_5c8,psVar3,pPVar8,(string *)&curves->velocities,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)target);
        ::std::__cxx11::string::~string((string *)local_5e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
        ::std::__cxx11::string::~string((string *)local_5c8);
        if ((local_5a8._0_4_ == Success) || (local_5a8._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_5a8._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_768);
          poVar9 = ::std::operator<<((ostream *)local_768,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc38);
          ::std::operator<<(poVar9," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_7a8,"Parsing attribute `{}` failed. Error: {}",&local_7a9);
          fmt::format<char[11],std::__cxx11::string>
                    (&local_788,(fmt *)local_7a8,(string *)"velocities",(char (*) [11])&ret_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
          poVar9 = ::std::operator<<((ostream *)local_768,(string *)&local_788);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::~string((string *)&local_788);
          ::std::__cxx11::string::~string(local_7a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_7d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_3.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_7d0);
            ::std::__cxx11::string::~string((string *)local_7d0);
            ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_768);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_5a8);
        if (__range2._4_4_ != 0) goto joined_r0x002af2fc;
        ::std::__cxx11::string::string((string *)local_838,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_858,"normals",&local_859);
        pPVar8 = (Property *)local_858;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  ((ParseResult *)local_818,(_anonymous_namespace_ *)local_78,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_838,psVar3,pPVar8,(string *)&curves->normals,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                    *)target);
        ::std::__cxx11::string::~string((string *)local_858);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_859);
        ::std::__cxx11::string::~string((string *)local_838);
        if ((local_818._0_4_ == Success) || (local_818._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_818._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_9d8);
          poVar9 = ::std::operator<<((ostream *)local_9d8,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc3a);
          ::std::operator<<(poVar9," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_a18,"Parsing attribute `{}` failed. Error: {}",&local_a19);
          fmt::format<char[8],std::__cxx11::string>
                    (&local_9f8,(fmt *)local_a18,(string *)"normals",(char (*) [8])&ret_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
          poVar9 = ::std::operator<<((ostream *)local_9d8,(string *)&local_9f8);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::~string((string *)&local_9f8);
          ::std::__cxx11::string::~string(local_a18);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a19);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_a40,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_4.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_a40);
            ::std::__cxx11::string::~string((string *)local_a40);
            ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_9d8);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_818);
        if (__range2._4_4_ != 0) goto joined_r0x002af2fc;
        ::std::__cxx11::string::string((string *)local_aa8,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_ac8,"accelerations",&local_ac9);
        pPVar8 = (Property *)local_ac8;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((ParseResult *)(local_aa8 + 0x20),(_anonymous_namespace_ *)local_78,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_aa8,psVar3,pPVar8,(string *)&curves->accelerations,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)target);
        ::std::__cxx11::string::~string((string *)local_ac8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
        ::std::__cxx11::string::~string((string *)local_aa8);
        if ((local_aa8._32_4_ == 0) || (local_aa8._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_aa8._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_c48);
          poVar9 = ::std::operator<<((ostream *)local_c48,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc3c);
          ::std::operator<<(poVar9," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_c88,"Parsing attribute `{}` failed. Error: {}",&local_c89);
          fmt::format<char[14],std::__cxx11::string>
                    (&local_c68,(fmt *)local_c88,(string *)"accelerations",(char (*) [14])&ret_4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
          poVar9 = ::std::operator<<((ostream *)local_c48,(string *)&local_c68);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::~string((string *)&local_c68);
          ::std::__cxx11::string::~string(local_c88);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c89);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_cb0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_5.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_cb0);
            ::std::__cxx11::string::~string((string *)local_cb0);
            ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_c48);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_aa8 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x002af2fc;
        ::std::__cxx11::string::string((string *)local_d18,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_d38,"widths",&local_d39);
        pPVar8 = (Property *)local_d38;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                  ((ParseResult *)(local_d18 + 0x20),(_anonymous_namespace_ *)local_78,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d18,psVar3,pPVar8,(string *)&curves->widths,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                    *)target);
        ::std::__cxx11::string::~string((string *)local_d38);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d39);
        ::std::__cxx11::string::~string((string *)local_d18);
        if ((local_d18._32_4_ == 0) || (local_d18._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_d18._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_eb8);
          poVar9 = ::std::operator<<((ostream *)local_eb8,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc3d);
          ::std::operator<<(poVar9," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_ef8,"Parsing attribute `{}` failed. Error: {}",&local_ef9);
          fmt::format<char[7],std::__cxx11::string>
                    (&local_ed8,(fmt *)local_ef8,(string *)"widths",(char (*) [7])&ret_5,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
          poVar9 = ::std::operator<<((ostream *)local_eb8,(string *)&local_ed8);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::~string((string *)&local_ed8);
          ::std::__cxx11::string::~string(local_ef8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_f20,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_f60 + 0x20));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_f20);
            ::std::__cxx11::string::~string((string *)local_f20);
            ::std::__cxx11::string::~string((string *)(local_f60 + 0x20));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_eb8);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_d18 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x002af2fc;
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)ret.err.field_2._8_8_,"type");
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_f60,"type",&local_f61);
          sVar7 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_78,(key_type *)local_f60);
          ::std::__cxx11::string::~string((string *)local_f60);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_f61);
          if (sVar7 == 0) {
            Property::value_type_name_abi_cxx11_
                      (&local_f88,(Property *)(ret.err.field_2._8_8_ + 0x20));
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var2 = ::std::operator==(&local_f88,&local_fa8);
            local_1a91 = false;
            if (_Var2) {
              bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              local_1a91 = false;
              if (bVar1) {
                local_1a91 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
              }
            }
            ::std::__cxx11::string::~string((string *)&local_fa8);
            ::std::__cxx11::string::~string((string *)&local_f88);
            if (local_1a91 == false) {
              fun._M_invoker =
                   (_Invoker_type)
                   Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,std::__cxx11::string>(std::__cxx11::string_const&)>
              ::
              function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomBasisCurves*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__0&,void>
                        ((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,std::__cxx11::string>(std::__cxx11::string_const&)>
                          *)local_11c0,
                         (anon_class_1_0_00000001 *)
                         ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_11e0,"type",&local_11e1);
              bVar1 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)(local_1228 + 0x20),
                         (function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_11c0);
              target = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                        *)err;
              bVar1 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Type,tinyusdz::GeomBasisCurves::Type>
                                (&local_11e0,(bool)(bVar1 & 1),
                                 (EnumHandlerFun<tinyusdz::GeomBasisCurves::Type> *)
                                 (local_1228 + 0x20),(Attribute *)fun._M_invoker,&curves->type,warn,
                                 err);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)(local_1228 + 0x20));
              ::std::__cxx11::string::~string((string *)&local_11e0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_11e1);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                pAVar5 = Attribute::metas((Attribute *)fun._M_invoker);
                pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Type>::metas
                                   (&curves->type);
                AttrMetas::operator=(pAVar6,pAVar5);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)local_1228,"type",(allocator *)(local_1260 + 0x37));
                pVar10 = ::std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_78,(value_type *)local_1228);
                local_1260._32_8_ = pVar10.first._M_node;
                local_1260[0x28] = pVar10.second;
                ::std::__cxx11::string::~string((string *)local_1228);
                ::std::allocator<char>::~allocator((allocator<char> *)(local_1260 + 0x37));
                __range2._4_4_ = 3;
              }
              else {
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
              }
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_11c0);
              goto joined_r0x002af2fc;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_1120);
            poVar9 = ::std::operator<<((ostream *)local_1120,"[warn]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc3f);
            ::std::operator<<(poVar9," ");
            poVar9 = ::std::operator<<((ostream *)local_1120,"No value assigned to `");
            poVar9 = ::std::operator<<(poVar9,"type");
            poVar9 = ::std::operator<<(poVar9,"` token attribute. Set default token value.");
            ::std::operator<<(poVar9,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1140,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_1180 + 0x20));
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_1140);
              ::std::__cxx11::string::~string((string *)local_1140);
              ::std::__cxx11::string::~string((string *)(local_1180 + 0x20));
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1120);
            pAVar4 = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
            pAVar5 = Attribute::metas(pAVar4);
            pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Type>::metas
                               (&curves->type);
            AttrMetas::operator=(pAVar6,pAVar5);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1180,"type",&local_1181);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,(value_type *)local_1180);
            ::std::__cxx11::string::~string((string *)local_1180);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1181);
          }
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ret.err.field_2._8_8_,"basis");
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1260,"basis",&local_1261);
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,(key_type *)local_1260);
            ::std::__cxx11::string::~string((string *)local_1260);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1261);
            if (sVar7 == 0) {
              Property::value_type_name_abi_cxx11_
                        (&local_1288,(Property *)(ret.err.field_2._8_8_ + 0x20));
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var2 = ::std::operator==(&local_1288,&local_12a8);
              local_1ab9 = false;
              if (_Var2) {
                bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                local_1ab9 = false;
                if (bVar1) {
                  local_1ab9 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
                }
              }
              ::std::__cxx11::string::~string((string *)&local_12a8);
              ::std::__cxx11::string::~string((string *)&local_1288);
              if (local_1ab9 == false) {
                fun_1._M_invoker =
                     (_Invoker_type)
                     Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,std::__cxx11::string>(std::__cxx11::string_const&)>
                ::
                function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomBasisCurves*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__1&,void>
                          ((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,std::__cxx11::string>(std::__cxx11::string_const&)>
                            *)local_14c0,
                           (anon_class_1_0_00000001 *)
                           ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_14e0,"basis",&local_14e1);
                bVar1 = options->strict_allowedToken_check;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)(local_1528 + 0x20),
                           (function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_14c0);
                target = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                          *)err;
                bVar1 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Basis,tinyusdz::GeomBasisCurves::Basis>
                                  (&local_14e0,(bool)(bVar1 & 1),
                                   (EnumHandlerFun<tinyusdz::GeomBasisCurves::Basis> *)
                                   (local_1528 + 0x20),(Attribute *)fun_1._M_invoker,&curves->basis,
                                   warn,err);
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)(local_1528 + 0x20));
                ::std::__cxx11::string::~string((string *)&local_14e0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_14e1);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pAVar5 = Attribute::metas((Attribute *)fun_1._M_invoker);
                  pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis>::metas
                                     (&curves->basis);
                  AttrMetas::operator=(pAVar6,pAVar5);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            ((string *)local_1528,"basis",(allocator *)(local_1560 + 0x37));
                  pVar10 = ::std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_78,(value_type *)local_1528);
                  local_1560._32_8_ = pVar10.first._M_node;
                  local_1560[0x28] = pVar10.second;
                  ::std::__cxx11::string::~string((string *)local_1528);
                  ::std::allocator<char>::~allocator((allocator<char> *)(local_1560 + 0x37));
                  __range2._4_4_ = 3;
                }
                else {
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                }
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Basis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)local_14c0);
                goto joined_r0x002af2fc;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_1420);
              poVar9 = ::std::operator<<((ostream *)local_1420,"[warn]");
              poVar9 = ::std::operator<<(poVar9,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar9 = ::std::operator<<(poVar9,":");
              poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
              poVar9 = ::std::operator<<(poVar9,"():");
              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc41);
              ::std::operator<<(poVar9," ");
              poVar9 = ::std::operator<<((ostream *)local_1420,"No value assigned to `");
              poVar9 = ::std::operator<<(poVar9,"basis");
              poVar9 = ::std::operator<<(poVar9,"` token attribute. Set default token value.");
              ::std::operator<<(poVar9,"\n");
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1440,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_1480 + 0x20));
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_1440);
                ::std::__cxx11::string::~string((string *)local_1440);
                ::std::__cxx11::string::~string((string *)(local_1480 + 0x20));
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1420);
              pAVar4 = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              pAVar5 = Attribute::metas(pAVar4);
              pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis>::metas
                                 (&curves->basis);
              AttrMetas::operator=(pAVar6,pAVar5);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_1480,"basis",&local_1481);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_78,(value_type *)local_1480);
              ::std::__cxx11::string::~string((string *)local_1480);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1481);
            }
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)ret.err.field_2._8_8_,"wrap");
            if (bVar1) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_1560,"wrap",&local_1561);
              sVar7 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_78,(key_type *)local_1560);
              ::std::__cxx11::string::~string((string *)local_1560);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1561);
              if (sVar7 == 0) {
                Property::value_type_name_abi_cxx11_
                          (&local_1588,(Property *)(ret.err.field_2._8_8_ + 0x20));
                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                _Var2 = ::std::operator==(&local_1588,&local_15a8);
                local_1ae1 = false;
                if (_Var2) {
                  bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                  local_1ae1 = false;
                  if (bVar1) {
                    local_1ae1 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
                  }
                }
                ::std::__cxx11::string::~string((string *)&local_15a8);
                ::std::__cxx11::string::~string((string *)&local_1588);
                if (local_1ae1 == false) {
                  fun_2._M_invoker =
                       (_Invoker_type)
                       Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                  ::std::
                  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,std::__cxx11::string>(std::__cxx11::string_const&)>
                  ::
                  function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomBasisCurves*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__2&,void>
                            ((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,std::__cxx11::string>(std::__cxx11::string_const&)>
                              *)local_17c0,
                             (anon_class_1_0_00000001 *)
                             ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 5));
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)&local_17e0,"wrap",&local_17e1);
                  bVar1 = options->strict_allowedToken_check;
                  ::std::
                  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)(local_1828 + 0x20),
                             (function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)local_17c0);
                  target = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                            *)err;
                  bVar1 = ParseUniformEnumProperty<tinyusdz::GeomBasisCurves::Wrap,tinyusdz::GeomBasisCurves::Wrap>
                                    (&local_17e0,(bool)(bVar1 & 1),
                                     (EnumHandlerFun<tinyusdz::GeomBasisCurves::Wrap> *)
                                     (local_1828 + 0x20),(Attribute *)fun_2._M_invoker,&curves->wrap
                                     ,warn,err);
                  ::std::
                  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                               *)(local_1828 + 0x20));
                  ::std::__cxx11::string::~string((string *)&local_17e0);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    pAVar5 = Attribute::metas((Attribute *)fun_2._M_invoker);
                    pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Wrap>::metas
                                       (&curves->wrap);
                    AttrMetas::operator=(pAVar6,pAVar5);
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string((string *)local_1828,"wrap",&local_1829);
                    ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_78,(value_type *)local_1828);
                    ::std::__cxx11::string::~string((string *)local_1828);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1829);
                    __range2._4_4_ = 3;
                  }
                  else {
                    spec_local._7_1_ = 0;
                    __range2._4_4_ = 1;
                  }
                  ::std::
                  function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomBasisCurves::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                               *)local_17c0);
                  goto joined_r0x002af2fc;
                }
                ::std::__cxx11::ostringstream::ostringstream(local_1720);
                poVar9 = ::std::operator<<((ostream *)local_1720,"[warn]");
                poVar9 = ::std::operator<<(poVar9,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar9 = ::std::operator<<(poVar9,":");
                poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
                poVar9 = ::std::operator<<(poVar9,"():");
                poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc43);
                ::std::operator<<(poVar9," ");
                poVar9 = ::std::operator<<((ostream *)local_1720,"No value assigned to `");
                poVar9 = ::std::operator<<(poVar9,"wrap");
                poVar9 = ::std::operator<<(poVar9,"` token attribute. Set default token value.");
                ::std::operator<<(poVar9,"\n");
                if (warn != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_1740,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_1780 + 0x20));
                  ::std::__cxx11::string::operator=((string *)warn,(string *)local_1740);
                  ::std::__cxx11::string::~string((string *)local_1740);
                  ::std::__cxx11::string::~string((string *)(local_1780 + 0x20));
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1720);
                pAVar4 = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                pAVar5 = Attribute::metas(pAVar4);
                pAVar6 = TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Wrap>::metas
                                   (&curves->wrap);
                AttrMetas::operator=(pAVar6,pAVar5);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_1780,"wrap",&local_1781);
                ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_78,(value_type *)local_1780);
                ::std::__cxx11::string::~string((string *)local_1780);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1781);
              }
            }
            else {
              sVar7 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_78,(key_type *)ret.err.field_2._8_8_);
              if (sVar7 == 0) {
                pPVar8 = (Property *)(ret.err.field_2._8_8_ + 0x20);
                this = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                     *)&(curves->super_GPrim).props,
                                    (key_type *)ret.err.field_2._8_8_);
                Property::operator=(this,pPVar8);
                ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_78,(value_type *)ret.err.field_2._8_8_);
              }
              sVar7 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_78,(key_type *)ret.err.field_2._8_8_);
              if (sVar7 == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_19c8);
                poVar9 = ::std::operator<<((ostream *)local_19c8,"[warn]");
                poVar9 = ::std::operator<<(poVar9,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar9 = ::std::operator<<(poVar9,":");
                poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
                poVar9 = ::std::operator<<(poVar9,"():");
                poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc47);
                ::std::operator<<(poVar9," ");
                ::std::operator+((char *)local_19e8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Unsupported/unimplemented property: ");
                poVar9 = ::std::operator<<((ostream *)local_19c8,local_19e8);
                ::std::operator<<(poVar9,"\n");
                ::std::__cxx11::string::~string(local_19e8);
                if (warn != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_1a08,local_1a28);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)local_1a08);
                  ::std::__cxx11::string::~string((string *)local_1a08);
                  ::std::__cxx11::string::~string((string *)local_1a28);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_19c8);
              }
            }
          }
        }
      }
      else {
joined_r0x002af2fc:
        if (__range2._4_4_ != 3) goto LAB_002afe02;
      }
LAB_002afde6:
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002afe02:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_78);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomBasisCurves *curves,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)options;

  DCOUT("GeomBasisCurves");

  auto BasisHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Basis, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Basis, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Basis::Bezier, "bezier"),
        std::make_pair(GeomBasisCurves::Basis::Bspline, "bspline"),
        std::make_pair(GeomBasisCurves::Basis::CatmullRom, "catmullRom"),
    };

    return EnumHandler<GeomBasisCurves::Basis>("basis", tok, enums);
  };

  auto TypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Type, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Type, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Type::Cubic, "cubic"),
        std::make_pair(GeomBasisCurves::Type::Linear, "linear"),
    };

    return EnumHandler<GeomBasisCurves::Type>("type", tok, enums);
  };

  auto WrapHandler = [](const std::string &tok)
      -> nonstd::expected<GeomBasisCurves::Wrap, std::string> {
    using EnumTy = std::pair<GeomBasisCurves::Wrap, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomBasisCurves::Wrap::Nonperiodic, "nonperiodic"),
        std::make_pair(GeomBasisCurves::Wrap::Periodic, "periodic"),
        std::make_pair(GeomBasisCurves::Wrap::Pinned, "periodic"),
    };

    return EnumHandler<GeomBasisCurves::Wrap>("wrap", tok, enums);
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, curves, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "curveVertexCounts", GeomBasisCurves,
                         curves->curveVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomBasisCurves, curves->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomBasisCurves,
                          curves->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomBasisCurves,
                  curves->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomBasisCurves,
                 curves->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomBasisCurves, curves->widths)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "type", GeomBasisCurves::Type, TypeHandler, GeomBasisCurves,
                       curves->type, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "basis", GeomBasisCurves::Basis, BasisHandler, GeomBasisCurves,
                       curves->basis, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "wrap", GeomBasisCurves::Wrap, WrapHandler, GeomBasisCurves,
                       curves->wrap, options.strict_allowedToken_check)

    ADD_PROPERTY(table, prop, GeomBasisCurves, curves->props)

    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}